

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool __thiscall Loop::RemoveBreakBlocks(Loop *this,FlowGraph *fg)

{
  code *pcVar1;
  BasicBlock **this_00;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  Func *pFVar3;
  undefined4 *puVar4;
  Type_conflict node;
  Type *ppBVar5;
  BasicBlock *pBVar6;
  byte local_b1;
  BasicBlock *local_b0;
  BasicBlock *exitLoopTail;
  BasicBlock *breakBlockStartPrev;
  BasicBlock *breakBlockStart;
  BasicBlock *breakBlockEnd;
  BasicBlock *blockStop;
  BasicBlock *blockPrev;
  BasicBlock **block;
  Iterator __iter;
  BasicBlock *loopTailBlock;
  bool breakBlockRelocated;
  FlowGraph *fg_local;
  Loop *this_local;
  
  loopTailBlock._7_1_ = false;
  pFVar3 = FlowGraph::GetFunc(fg);
  sourceContextId = Func::GetSourceContextId(pFVar3);
  pFVar3 = FlowGraph::GetFunc(fg);
  functionId = Func::GetLocalFunctionId(pFVar3);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,RemoveBreakBlockPhase,sourceContextId,functionId);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    __iter.current = (NodeBase *)0x0;
    _block = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                       (&(this->blockList).
                         super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>);
    while( true ) {
      if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      this_00 = block;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node)
      ;
      if (bVar2) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppBVar5 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&block);
      if ((*(ushort *)&(*ppBVar5)->field_0x18 & 1) == 0) {
        __iter.current = (NodeBase *)*ppBVar5;
      }
    }
    if (__iter.current == (NodeBase *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x412,"(loopTailBlock)","loopTailBlock");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pBVar6 = GetHeadBlock(this);
    if (pBVar6 == (BasicBlock *)0x0) {
      local_b0 = (BasicBlock *)0x0;
    }
    else {
      pBVar6 = GetHeadBlock(this);
      local_b0 = pBVar6->prev;
    }
    breakBlockStart = (BasicBlock *)__iter.current;
    while (breakBlockStart != local_b0) {
      blockStop = breakBlockStart->prev;
      if ((*(ushort *)&breakBlockStart->field_0x18 & 1) == 0) {
        while (bVar2 = IsDescendentOrSelf(this,breakBlockStart->loop), ((bVar2 ^ 0xffU) & 1) != 0) {
          loopTailBlock._7_1_ = true;
          *(ushort *)&breakBlockStart->field_0x18 =
               *(ushort *)&breakBlockStart->field_0x18 & 0xfeff | 0x100;
          breakBlockStartPrev = breakBlockStart;
          exitLoopTail = BasicBlock::GetPrev(breakBlockStart);
          while( true ) {
            local_b1 = 1;
            if (exitLoopTail->loop != breakBlockStart->loop) {
              bVar2 = IsDescendentOrSelf(this,exitLoopTail->loop);
              local_b1 = bVar2 ^ 0xff;
            }
            if ((local_b1 & 1) == 0) break;
            breakBlockStartPrev = exitLoopTail;
            exitLoopTail = BasicBlock::GetPrev(exitLoopTail);
          }
          *(ushort *)&breakBlockStartPrev->field_0x18 =
               *(ushort *)&breakBlockStartPrev->field_0x18 & 0xfeff | 0x100;
          FlowGraph::MoveBlocksBefore
                    (fg,breakBlockStartPrev,breakBlockStart,(BasicBlock *)(__iter.current)->next);
          FlowGraph::Dump(fg,true,L"\n After Each iteration of canonicalization \n");
          breakBlockStart = (BasicBlock *)__iter.current;
          blockStop = (BasicBlock *)__iter.current[1].next;
        }
      }
      breakBlockStart = blockStop;
    }
    this_local._7_1_ = loopTailBlock._7_1_;
  }
  return this_local._7_1_;
}

Assistant:

bool
Loop::RemoveBreakBlocks(FlowGraph *fg)
{
    bool breakBlockRelocated = false;
    if (PHASE_OFF(Js::RemoveBreakBlockPhase, fg->GetFunc()))
    {
        return false;
    }

    BasicBlock *loopTailBlock = nullptr;
    FOREACH_BLOCK_IN_LOOP(block, this)
    {
        loopTailBlock = block;
    }NEXT_BLOCK_IN_LOOP;

    AnalysisAssert(loopTailBlock);

    FOREACH_BLOCK_BACKWARD_IN_RANGE_EDITING(breakBlockEnd, loopTailBlock, this->GetHeadBlock(), blockPrev)
    {
        while (!this->IsDescendentOrSelf(breakBlockEnd->loop))
        {
            // Found at least one break block;
            breakBlockRelocated = true;

#if DBG
            breakBlockEnd->isBreakBlock = true;
#endif
            // Find the first block in this break block sequence.
            BasicBlock *breakBlockStart = breakBlockEnd;
            BasicBlock *breakBlockStartPrev = breakBlockEnd->GetPrev();

            // Walk back the blocks until we find a block which belongs to that block.
            // Note: We don't really care if there are break blocks corresponding to different loops. We move the blocks conservatively to the end of the loop.

            // Algorithm works on one loop at a time.
            while((breakBlockStartPrev->loop == breakBlockEnd->loop) || !this->IsDescendentOrSelf(breakBlockStartPrev->loop))
            {
                breakBlockStart = breakBlockStartPrev;
                breakBlockStartPrev = breakBlockStartPrev->GetPrev();
            }

#if DBG
            breakBlockStart->isBreakBlock = true; // Mark the first block as well.
#endif

            BasicBlock *exitLoopTail = loopTailBlock;
            // Move these break blocks to the tail of the loop.
            fg->MoveBlocksBefore(breakBlockStart, breakBlockEnd, exitLoopTail->next);

#if DBG_DUMP
            fg->Dump(true /*needs verbose flag*/, _u("\n After Each iteration of canonicalization \n"));
#endif
            // Again be conservative, there are edits to the loop graph. Start fresh for this loop.
            breakBlockEnd = loopTailBlock;
            blockPrev = breakBlockEnd->prev;
        }
    } NEXT_BLOCK_BACKWARD_IN_RANGE_EDITING;

    return breakBlockRelocated;
}